

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedCollator::RuleBasedCollator(RuleBasedCollator *this,RuleBasedCollator *other)

{
  CollationSettings *pCVar1;
  CollationCacheEntry *pCVar2;
  
  Collator::Collator(&this->super_Collator,&other->super_Collator);
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_003dd2e0;
  pCVar1 = other->settings;
  this->data = other->data;
  this->settings = pCVar1;
  pCVar2 = other->cacheEntry;
  this->tailoring = other->tailoring;
  this->cacheEntry = pCVar2;
  Locale::Locale(&this->validLocale,&other->validLocale);
  this->explicitlySetAttributes = other->explicitlySetAttributes;
  this->actualLocaleIsSameAsValid = other->actualLocaleIsSameAsValid;
  SharedObject::addRef(&this->settings->super_SharedObject);
  SharedObject::addRef(&this->cacheEntry->super_SharedObject);
  return;
}

Assistant:

RuleBasedCollator::RuleBasedCollator(const RuleBasedCollator &other)
        : Collator(other),
          data(other.data),
          settings(other.settings),
          tailoring(other.tailoring),
          cacheEntry(other.cacheEntry),
          validLocale(other.validLocale),
          explicitlySetAttributes(other.explicitlySetAttributes),
          actualLocaleIsSameAsValid(other.actualLocaleIsSameAsValid) {
    settings->addRef();
    cacheEntry->addRef();
}